

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareCompatibleUnitsWhichAreDimensionless_Test::TestBody
          (Units_compareCompatibleUnitsWhichAreDimensionless_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u5;
  UnitsPtr u1;
  UnitsPtr u2;
  UnitsPtr u4;
  UnitsPtr u3;
  ModelPtr model;
  long *local_c8;
  AssertionResult local_c0;
  long local_b0 [2];
  AssertHelper local_a0 [8];
  char local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78 [2];
  string *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  shared_ptr *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Model::create();
  libcellml::Units::create();
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"dimensionless","");
  libcellml::NamedEntity::setName(local_68);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_58;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"testunit2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_58;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"metre","");
  local_88 = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,-2.0,(string *)&local_c0);
  if (local_88 != (string *)local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"metre","");
  local_88 = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(local_58,2.0,(string *)&local_c0);
  if (local_88 != (string *)local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_38;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"testunit3","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"steradian","");
  libcellml::Units::addUnit(local_38);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_48;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"testunit4","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_48;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"metre","");
  local_88 = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_c0);
  if (local_88 != (string *)local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"metre","");
  local_88 = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(local_48,-1.0,(string *)&local_c0);
  if (local_88 != (string *)local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_88;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"testunit5","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  psVar1 = local_88;
  local_c0._0_8_ = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"radian","");
  libcellml::Units::addUnit(psVar1);
  if ((long *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
  }
  libcellml::Model::addUnits(local_28);
  libcellml::Model::addUnits(local_28);
  libcellml::Model::addUnits(local_28);
  local_98[0] = libcellml::Units::compatible((shared_ptr *)&local_68,(shared_ptr *)&local_58);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98[0] == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,local_98,"libcellml::Units::compatible(u1, u2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x7d1,(char *)local_c0._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
    }
    if (local_c8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8 != (long *)0x0)) {
        (**(code **)(*local_c8 + 8))();
      }
      local_c8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98[0] = libcellml::Units::compatible((shared_ptr *)&local_68,(shared_ptr *)&local_38);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98[0] == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,local_98,"libcellml::Units::compatible(u1, u3)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x7d2,(char *)local_c0._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
    }
    if (local_c8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8 != (long *)0x0)) {
        (**(code **)(*local_c8 + 8))();
      }
      local_c8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98[0] = libcellml::Units::compatible((shared_ptr *)&local_68,(shared_ptr *)&local_48);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98[0] == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,local_98,"libcellml::Units::compatible(u1, u4)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x7d3,(char *)local_c0._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
    }
    if (local_c8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8 != (long *)0x0)) {
        (**(code **)(*local_c8 + 8))();
      }
      local_c8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98[0] = libcellml::Units::compatible((shared_ptr *)&local_68,(shared_ptr *)&local_88);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98[0] == '\0') {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,local_98,"libcellml::Units::compatible(u1, u5)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x7d4,(char *)local_c0._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0] + 1);
    }
    if (local_c8 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c8 != (long *)0x0)) {
        (**(code **)(*local_c8 + 8))();
      }
      local_c8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, compareCompatibleUnitsWhichAreDimensionless)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    // u1 = u2 = u3: testing that cancelled units become dimensionless and equivalent to radians, steradians, etc.
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("dimensionless");
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("testunit2");
    u2->addUnit("metre", -2.0);
    u2->addUnit("metre", 2.0);
    libcellml::UnitsPtr u3 = libcellml::Units::create();
    u3->setName("testunit3");
    u3->addUnit("steradian");
    libcellml::UnitsPtr u4 = libcellml::Units::create();
    u4->setName("testunit4");
    u4->addUnit("metre", 1.0);
    u4->addUnit("metre", -1.0);
    libcellml::UnitsPtr u5 = libcellml::Units::create();
    u5->setName("testunit5");
    u5->addUnit("radian");

    model->addUnits(u1);
    model->addUnits(u2);
    model->addUnits(u3);

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
    EXPECT_TRUE(libcellml::Units::compatible(u1, u3));
    EXPECT_TRUE(libcellml::Units::compatible(u1, u4));
    EXPECT_TRUE(libcellml::Units::compatible(u1, u5));
}